

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O1

int decode_fglrx_ioctl(uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
                      uint64_t ret,uint64_t err,void *state,mmt_memory_dump *args,int argc,
                      char *name)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  int *piVar4;
  long lVar5;
  byte bVar6;
  undefined6 in_register_00000082;
  long lVar7;
  int iVar8;
  
  piVar4 = (int *)CONCAT71(in_register_00000011,dir);
  lVar5 = 0;
  lVar7 = 0x2857f0;
  do {
    if (*(uint32_t *)((long)&fglrx_ioctls[0].id + lVar5) == id) {
      lVar7 = (long)&fglrx_ioctls[0].id + lVar5;
      bVar6 = 1;
      if (*(int *)((long)&fglrx_ioctls[0].size + lVar5) == *piVar4) {
        if ((dump_decoded_ioctl_data == 0) ||
           (*(int *)((long)&fglrx_ioctls[0].disabled + lVar5) != 0)) {
          bVar3 = false;
        }
        else {
          uVar1 = *(undefined8 *)((long)&fglrx_ioctls[0].name + lVar5);
          if (indent_logs == 0) {
            fprintf(_stdout,"LOG: %-26s %-5s fd: %d, ",uVar1,err,(ulong)fd);
          }
          else {
            fprintf(_stdout,"%64s%-26s %-5s fd: %d, "," ",uVar1,err,(ulong)fd);
          }
          if (CONCAT71(in_register_00000009,nr) != 0) {
            fprintf(_stdout,"ret: %ld, ",CONCAT71(in_register_00000009,nr));
          }
          if (CONCAT62(in_register_00000082,size) != 0) {
            fprintf(_stdout,"%serr: %ld%s, ",colors->err,CONCAT62(in_register_00000082,size),
                    colors->reset);
          }
          fglrx_pfx = "";
          pcVar2 = *(code **)((long)&fglrx_ioctls[0].fun + lVar5);
          if (pcVar2 != (code *)0x0) {
            (*pcVar2)(piVar4 + 1);
          }
          pcVar2 = *(code **)((long)&fglrx_ioctls[0].fun_with_args + lVar5);
          if (pcVar2 == (code *)0x0) {
            bVar3 = false;
          }
          else {
            (*pcVar2)(piVar4 + 1,buf,ret & 0xffffffff);
            bVar3 = false;
            bVar6 = 0;
          }
        }
      }
      else {
        bVar3 = true;
      }
      goto LAB_00249f98;
    }
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0x3f0);
  bVar3 = true;
  bVar6 = 1;
LAB_00249f98:
  iVar8 = 1;
  if (!bVar3) {
    if ((((bool)(bVar6 & dump_decoded_ioctl_data != 0)) && (*(int *)(lVar7 + 0x28) == 0)) ||
       (dump_raw_ioctl_data != 0)) {
      iVar8 = 0;
      dump_args((mmt_memory_dump *)buf,(int)ret,0);
    }
    else {
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

static int decode_fglrx_ioctl(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr,
		uint16_t size, struct mmt_buf *buf, uint64_t ret, uint64_t err,
		void *state, struct mmt_memory_dump *args, int argc, const char *name)
{
	int k, found = 0;
	int args_used = 0;
	void (*fun)(void *) = NULL;
	void (*fun_with_args)(void *, struct mmt_memory_dump *, int argc) = NULL;

	struct fglrx_ioctl *ioctl;
	for (k = 0; k < fglrx_ioctls_cnt; ++k)
	{
		ioctl = &fglrx_ioctls[k];
		if (ioctl->id == id)
		{
			if (ioctl->size == buf->len)
			{
				if (dump_decoded_ioctl_data && !ioctl->disabled)
				{
					mmt_log("%-26s %-5s fd: %d, ", ioctl->name, name, fd);
					if (ret)
						mmt_log_cont("ret: %" PRId64 ", ", ret);
					if (err)
						mmt_log_cont("%serr: %" PRId64 "%s, ", colors->err, err, colors->reset);

					fglrx_reset_pfx();
					fun = ioctl->fun;
					if (fun)
						fun(buf->data);
					fun_with_args = ioctl->fun_with_args;
					if (fun_with_args)
					{
						fun_with_args(buf->data, args, argc);
						args_used = 1;
					}
				}
				found = 1;
			}
			break;
		}
	}

	if (!found)
		return 1;

	if ((!args_used && dump_decoded_ioctl_data && !ioctl->disabled) || dump_raw_ioctl_data)
		dump_args(args, argc, 0);

	return 0;
}